

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

void __thiscall cmCTestSVN::ExternalParser::DoPath(ExternalParser *this,string *path)

{
  ulong __n;
  cmCTestSVN *pcVar1;
  int iVar2;
  string local_path;
  char *local_100;
  undefined8 local_f8;
  char local_f0 [16];
  SVNInfo local_e0;
  
  local_100 = local_f0;
  local_f8 = 0;
  local_f0[0] = '\0';
  __n = (this->SVN->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_string_length;
  if (__n < path->_M_string_length) {
    iVar2 = strncmp((path->_M_dataplus)._M_p,
                    (this->SVN->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_dataplus.
                    _M_p,__n);
    if (iVar2 == 0) {
      std::__cxx11::string::assign((char *)&local_100);
      goto LAB_002ffb6c;
    }
  }
  std::__cxx11::string::_M_assign((string *)&local_100);
LAB_002ffb6c:
  pcVar1 = this->SVN;
  SVNInfo::SVNInfo(&local_e0,local_100);
  std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::push_back
            (&pcVar1->Repositories,&local_e0);
  SVNInfo::~SVNInfo(&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  return;
}

Assistant:

void DoPath(std::string const& path)
    {
    // Get local path relative to the source directory
    std::string local_path;
    if(path.size() > this->SVN->SourceDirectory.size() &&
       strncmp(path.c_str(), this->SVN->SourceDirectory.c_str(),
               this->SVN->SourceDirectory.size()) == 0)
      {
      local_path = path.c_str() + this->SVN->SourceDirectory.size() + 1;
      }
    else
      {
      local_path = path;
      }
    this->SVN->Repositories.push_back( SVNInfo(local_path.c_str()) );
    }